

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascii-parser-basetype.cc
# Opt level: O1

bool __thiscall
tinyusdz::ascii::AsciiParser::SepBy1BasicType<tinyusdz::Path>
          (AsciiParser *this,char sep,char end_symbol,
          vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *result)

{
  pointer pPVar1;
  pointer pPVar2;
  StreamReader *pSVar3;
  bool bVar4;
  ulong uVar5;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar6;
  char cVar7;
  pointer this_00;
  Path value;
  char c;
  Path local_120;
  string local_50;
  
  pPVar1 = (result->super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pPVar2 = (result->super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  this_00 = pPVar1;
  if (pPVar2 != pPVar1) {
    do {
      Path::~Path(this_00);
      this_00 = this_00 + 1;
    } while (this_00 != pPVar2);
    (result->super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>)._M_impl.
    super__Vector_impl_data._M_finish = pPVar1;
  }
  bVar4 = SkipWhitespaceAndNewline(this,true);
  if (bVar4) {
    local_120._prim_part._M_dataplus._M_p = (pointer)&local_120._prim_part.field_2;
    local_120._prim_part._M_string_length = 0;
    local_120._prim_part.field_2._M_local_buf[0] = '\0';
    local_120._prop_part._M_dataplus._M_p = (pointer)&local_120._prop_part.field_2;
    local_120._prop_part._M_string_length = 0;
    local_120._prop_part.field_2._M_local_buf[0] = '\0';
    local_120._variant_part._M_dataplus._M_p = (pointer)&local_120._variant_part.field_2;
    local_120._variant_part._M_string_length = 0;
    local_120._variant_part.field_2._M_local_buf[0] = '\0';
    local_120._variant_selection_part._M_dataplus._M_p =
         (pointer)&local_120._variant_selection_part.field_2;
    local_120._variant_selection_part._M_string_length = 0;
    local_120._variant_selection_part.field_2._M_local_buf[0] = '\0';
    local_120._variant_part_str._M_dataplus._M_p = (pointer)&local_120._variant_part_str.field_2;
    local_120._variant_part_str._M_string_length = 0;
    local_120._variant_part_str.field_2._M_local_buf[0] = '\0';
    local_120._element._M_dataplus._M_p = (pointer)&local_120._element.field_2;
    local_120._element._M_string_length = 0;
    local_120._element.field_2._M_local_buf[0] = '\0';
    local_120._path_type.has_value_ = false;
    local_120._path_type.contained = (storage_t<tinyusdz::Path::PathType>)0x0;
    local_120._valid = false;
    bVar4 = ReadBasicType(this,&local_120);
    if (bVar4) {
      ::std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::push_back(result,&local_120);
    }
    else {
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_50,"Not starting with the value of requested type.\n","");
      PushError(this,&local_50);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
    }
    paVar6 = &local_120._prim_part.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_120._element._M_dataplus._M_p != &local_120._element.field_2) {
      operator_delete(local_120._element._M_dataplus._M_p,
                      CONCAT71(local_120._element.field_2._M_allocated_capacity._1_7_,
                               local_120._element.field_2._M_local_buf[0]) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_120._variant_part_str._M_dataplus._M_p != &local_120._variant_part_str.field_2) {
      operator_delete(local_120._variant_part_str._M_dataplus._M_p,
                      CONCAT71(local_120._variant_part_str.field_2._M_allocated_capacity._1_7_,
                               local_120._variant_part_str.field_2._M_local_buf[0]) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_120._variant_selection_part._M_dataplus._M_p !=
        &local_120._variant_selection_part.field_2) {
      operator_delete(local_120._variant_selection_part._M_dataplus._M_p,
                      CONCAT71(local_120._variant_selection_part.field_2._M_allocated_capacity._1_7_
                               ,local_120._variant_selection_part.field_2._M_local_buf[0]) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_120._variant_part._M_dataplus._M_p != &local_120._variant_part.field_2) {
      operator_delete(local_120._variant_part._M_dataplus._M_p,
                      CONCAT71(local_120._variant_part.field_2._M_allocated_capacity._1_7_,
                               local_120._variant_part.field_2._M_local_buf[0]) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_120._prop_part._M_dataplus._M_p != &local_120._prop_part.field_2) {
      operator_delete(local_120._prop_part._M_dataplus._M_p,
                      CONCAT71(local_120._prop_part.field_2._M_allocated_capacity._1_7_,
                               local_120._prop_part.field_2._M_local_buf[0]) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_120._prim_part._M_dataplus._M_p != paVar6) {
      operator_delete(local_120._prim_part._M_dataplus._M_p,
                      CONCAT71(local_120._prim_part.field_2._M_allocated_capacity._1_7_,
                               local_120._prim_part.field_2._M_local_buf[0]) + 1);
    }
    if (bVar4) {
      do {
        pSVar3 = this->_sr;
        if ((pSVar3->length_ <= pSVar3->idx_) || (pSVar3->binary_[pSVar3->idx_] == '\0'))
        goto LAB_0039eba4;
        bVar4 = SkipCommentAndWhitespaceAndNewline(this,true);
        if (!bVar4) {
          return false;
        }
        bVar4 = Char1(this,(char *)&local_50);
        cVar7 = '\x01';
        if (bVar4) {
          if ((char)local_50._M_dataplus._M_p == sep) {
            bVar4 = SkipCommentAndWhitespaceAndNewline(this,true);
            if (bVar4) {
              bVar4 = LookChar1(this,(char *)&local_120);
              cVar7 = ((char)local_120._prim_part._M_dataplus._M_p == end_symbol) * '\x03';
              if (!bVar4) {
                cVar7 = '\x01';
              }
              if ((char)local_120._prim_part._M_dataplus._M_p != end_symbol && bVar4)
              goto LAB_0039e9c8;
            }
          }
          else {
LAB_0039e9c8:
            if ((char)local_50._M_dataplus._M_p == sep) {
              cVar7 = '\x01';
              bVar4 = SkipWhitespaceAndNewline(this,true);
              if (bVar4) {
                local_120._prim_part._M_string_length = 0;
                local_120._prim_part.field_2._M_local_buf[0] = '\0';
                local_120._prop_part._M_dataplus._M_p = (pointer)&local_120._prop_part.field_2;
                local_120._prop_part._M_string_length = 0;
                local_120._prop_part.field_2._M_local_buf[0] = '\0';
                local_120._variant_part._M_dataplus._M_p = (pointer)&local_120._variant_part.field_2
                ;
                local_120._variant_part._M_string_length = 0;
                local_120._variant_part.field_2._M_local_buf[0] = '\0';
                local_120._variant_selection_part._M_dataplus._M_p =
                     (pointer)&local_120._variant_selection_part.field_2;
                local_120._variant_selection_part._M_string_length = 0;
                local_120._variant_selection_part.field_2._M_local_buf[0] = '\0';
                local_120._variant_part_str._M_dataplus._M_p =
                     (pointer)&local_120._variant_part_str.field_2;
                local_120._variant_part_str._M_string_length = 0;
                local_120._variant_part_str.field_2._M_local_buf[0] = '\0';
                local_120._element._M_dataplus._M_p = (pointer)&local_120._element.field_2;
                local_120._element._M_string_length = 0;
                local_120._element.field_2._M_local_buf[0] = '\0';
                local_120._path_type.has_value_ = false;
                local_120._path_type.contained = (storage_t<tinyusdz::Path::PathType>)0x0;
                local_120._valid = false;
                local_120._prim_part._M_dataplus._M_p = (pointer)paVar6;
                bVar4 = ReadBasicType(this,&local_120);
                cVar7 = '\x03';
                if (bVar4) {
                  ::std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::push_back
                            (result,&local_120);
                  cVar7 = '\0';
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_120._element._M_dataplus._M_p != &local_120._element.field_2) {
                  operator_delete(local_120._element._M_dataplus._M_p,
                                  CONCAT71(local_120._element.field_2._M_allocated_capacity._1_7_,
                                           local_120._element.field_2._M_local_buf[0]) + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_120._variant_part_str._M_dataplus._M_p !=
                    &local_120._variant_part_str.field_2) {
                  operator_delete(local_120._variant_part_str._M_dataplus._M_p,
                                  CONCAT71(local_120._variant_part_str.field_2._M_allocated_capacity
                                           ._1_7_,local_120._variant_part_str.field_2._M_local_buf
                                                  [0]) + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_120._variant_selection_part._M_dataplus._M_p !=
                    &local_120._variant_selection_part.field_2) {
                  operator_delete(local_120._variant_selection_part._M_dataplus._M_p,
                                  CONCAT71(local_120._variant_selection_part.field_2.
                                           _M_allocated_capacity._1_7_,
                                           local_120._variant_selection_part.field_2._M_local_buf[0]
                                          ) + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_120._variant_part._M_dataplus._M_p != &local_120._variant_part.field_2)
                {
                  operator_delete(local_120._variant_part._M_dataplus._M_p,
                                  CONCAT71(local_120._variant_part.field_2._M_allocated_capacity.
                                           _1_7_,local_120._variant_part.field_2._M_local_buf[0]) +
                                  1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_120._prop_part._M_dataplus._M_p != &local_120._prop_part.field_2) {
                  operator_delete(local_120._prop_part._M_dataplus._M_p,
                                  CONCAT71(local_120._prop_part.field_2._M_allocated_capacity._1_7_,
                                           local_120._prop_part.field_2._M_local_buf[0]) + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_120._prim_part._M_dataplus._M_p != paVar6) {
                  operator_delete(local_120._prim_part._M_dataplus._M_p,
                                  CONCAT71(local_120._prim_part.field_2._M_allocated_capacity._1_7_,
                                           local_120._prim_part.field_2._M_local_buf[0]) + 1);
                }
              }
            }
            else {
              pSVar3 = this->_sr;
              cVar7 = '\x03';
              if ((0 < (long)pSVar3->idx_) && (uVar5 = pSVar3->idx_ - 1, uVar5 <= pSVar3->length_))
              {
                pSVar3->idx_ = uVar5;
              }
            }
          }
        }
      } while (cVar7 == '\0');
      if (cVar7 != '\x01') {
LAB_0039eba4:
        if ((result->super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>)._M_impl.
            super__Vector_impl_data._M_start !=
            (result->super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>)._M_impl.
            super__Vector_impl_data._M_finish) {
          return true;
        }
        local_120._prim_part._M_dataplus._M_p = (pointer)paVar6;
        ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_120,"Empty array.\n","");
        PushError(this,(string *)&local_120);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_120._prim_part._M_dataplus._M_p != paVar6) {
          operator_delete(local_120._prim_part._M_dataplus._M_p,
                          CONCAT71(local_120._prim_part.field_2._M_allocated_capacity._1_7_,
                                   local_120._prim_part.field_2._M_local_buf[0]) + 1);
        }
      }
    }
  }
  return false;
}

Assistant:

bool AsciiParser::SepBy1BasicType(const char sep, const char end_symbol, std::vector<T> *result) {
  result->clear();

  if (!SkipWhitespaceAndNewline()) {
    return false;
  }

  {
    T value;
    if (!ReadBasicType(&value)) {
      PushError("Not starting with the value of requested type.\n");
      return false;
    }

    result->push_back(value);
  }

  while (!Eof()) {
    if (!SkipCommentAndWhitespaceAndNewline()) {
      return false;
    }

    // sep
    char c;
    if (!Char1(&c)) {
      return false;
    }

    if (c == sep) {
      // Look next token
      if (!SkipCommentAndWhitespaceAndNewline()) {
        return false;
      }

      char nc;
      if (!LookChar1(&nc)) {
        return false;
      }

      if (nc == end_symbol) {
        // end
        break;
      }
    }

    if (c != sep) {
      // end
      _sr->seek_from_current(-1);  // unwind single char
      break;
    }

    if (!SkipWhitespaceAndNewline()) {
      return false;
    }

    T value;
    if (!ReadBasicType(&value)) {
      break;
    }

    result->push_back(value);


  }

  if (result->empty()) {
    PushError("Empty array.\n");
    return false;
  }

  return true;
}